

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:598:52)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:598:52)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  uint32_t uVar1;
  value *v;
  gc_heap_ptr_untyped *pgVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  undefined8 extraout_RDX_02;
  long lVar6;
  pointer pvVar7;
  mjs *pmVar8;
  long lVar9;
  wstring_view local_108;
  undefined1 local_f8 [40];
  vector<mjs::value,_std::allocator<mjs::value>_> values;
  wstring local_b8;
  anon_class_48_2_bfc5d542 sort_compare;
  value comparefn;
  
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  pgVar2 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar2);
  h = (gc_heap *)puVar3[1];
  comparefn.type_ = reference;
  comparefn._4_4_ = 0;
  comparefn.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x177954;
  (**(code **)*puVar3)(&sort_compare,puVar3);
  uVar1 = to_uint32(&sort_compare.comparefn);
  value::~value(&sort_compare.comparefn);
  pvVar7 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar7 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar7 = (pointer)&value::undefined;
  }
  value::value(&comparefn,pvVar7);
  value::value(&sort_compare.comparefn,&comparefn);
  sort_compare.h = h;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            (&values,(ulong)uVar1,(allocator_type *)local_f8);
  lVar9 = (ulong)uVar1 * 0x28;
  pmVar8 = (mjs *)0x0;
  uVar5 = extraout_RDX;
  for (lVar6 = 0;
      pvVar7 = values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
               super__Vector_impl_data._M_start, lVar9 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
    index_string_abi_cxx11_(&local_b8,pmVar8,(uint32_t)uVar5);
    local_108._M_len = local_b8._M_string_length;
    local_108._M_str = local_b8._M_dataplus._M_p;
    (**(code **)*puVar3)((value *)local_f8,puVar3,&local_108);
    value::operator=((value *)((long)&(values.
                                       super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->type_ + lVar6),
                     (value *)local_f8);
    value::~value((value *)local_f8);
    std::__cxx11::wstring::~wstring((wstring *)&local_b8);
    pmVar8 = (mjs *)(ulong)((int)pmVar8 + 1);
    uVar5 = extraout_RDX_00;
  }
  if (values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start !=
      values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
                         *)local_f8,
                        (__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                         )values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl
                          .super__Vector_impl_data._M_start,
                        (((long)values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x28 + 1) / 2);
    if ((value *)local_f8._16_8_ == (value *)0x0) {
      std::operator()((__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                       )pvVar7,(__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                )values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:632:56)>
                       )&sort_compare);
    }
    else {
      std::operator()((__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                       )pvVar7,(__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
                                )values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(value *)local_f8._16_8_,
                      local_f8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:632:56)>
                       )&sort_compare);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>,_mjs::value>
                *)local_f8);
  }
  pgVar2 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  plVar4 = (long *)gc_heap_ptr_untyped::get(pgVar2);
  pmVar8 = (mjs *)0x0;
  uVar5 = extraout_RDX_01;
  for (lVar6 = 0; lVar9 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
    index_string_abi_cxx11_((wstring *)local_f8,pmVar8,(uint32_t)uVar5);
    local_108._M_len = local_f8._8_8_;
    local_108._M_str = (wchar_t *)local_f8._0_8_;
    string::string((string *)&local_b8,h,&local_108);
    (**(code **)(*plVar4 + 8))
              (plVar4,&local_b8,
               (long)&(values.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                       super__Vector_impl_data._M_start)->type_ + lVar6,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b8);
    std::__cxx11::wstring::~wstring((wstring *)local_f8);
    pmVar8 = (mjs *)(ulong)((int)pmVar8 + 1);
    uVar5 = extraout_RDX_02;
  }
  value::value(__return_storage_ptr__,this_);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&values);
  value::~value(&sort_compare.comparefn);
  value::~value(&comparefn);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }